

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

int slang::ast::AssertionExpr::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SyntaxKind SVar1;
  byte bVar2;
  int iVar3;
  ParenthesizedSequenceExprSyntax *pPVar4;
  SequenceExprSyntax *pSVar5;
  undefined4 extraout_var;
  undefined4 in_register_0000003c;
  SyntaxNode *this;
  ASTContext *in_stack_00000008;
  ASTContext *in_stack_00000010;
  ParenthesizedSequenceExprSyntax *pse;
  AssertionExpr *result;
  ASTContext ctx;
  bool in_stack_000000b7;
  ASTContext *in_stack_000000b8;
  SimpleSequenceExprSyntax *in_stack_000000c0;
  ASTContext *in_stack_00000340;
  DelayedSequenceExprSyntax *in_stack_00000348;
  AssertionExpr *local_68;
  bitmask<slang::ast::ASTFlags> local_60;
  ASTContext *context;
  FirstMatchSequenceExprSyntax *syntax;
  bitmask<slang::ast::ASTFlags> local_48;
  undefined8 uStack_40;
  ASTContext *context_00;
  ParenthesizedSequenceExprSyntax *syntax_00;
  undefined7 in_stack_ffffffffffffffe8;
  
  this = (SyntaxNode *)CONCAT44(in_register_0000003c,__fd);
  bVar2 = (byte)__len & 1;
  context = *(ASTContext **)__addr;
  syntax = *(FirstMatchSequenceExprSyntax **)(__addr->sa_data + 6);
  local_48.m_bits._0_2_ = __addr[1].sa_family;
  local_48.m_bits._2_1_ = __addr[1].sa_data[0];
  local_48.m_bits._3_1_ = __addr[1].sa_data[1];
  local_48.m_bits._4_1_ = __addr[1].sa_data[2];
  local_48.m_bits._5_1_ = __addr[1].sa_data[3];
  local_48.m_bits._6_1_ = __addr[1].sa_data[4];
  local_48.m_bits._7_1_ = __addr[1].sa_data[5];
  uStack_40 = *(undefined8 *)(__addr[1].sa_data + 6);
  context_00 = *(ASTContext **)(__addr + 2);
  syntax_00 = *(ParenthesizedSequenceExprSyntax **)(__addr[2].sa_data + 6);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_60,AssignmentDisallowed);
  bitmask<slang::ast::ASTFlags>::operator|=(&local_48,&local_60);
  SVar1 = this->kind;
  if (SVar1 != AndSequenceExpr) {
    if (SVar1 == ClockingSequenceExpr) {
      slang::syntax::SyntaxNode::as<slang::syntax::ClockingSequenceExprSyntax>(this);
      local_68 = ClockingAssertionExpr::fromSyntax
                           ((ClockingSequenceExprSyntax *)__addr,
                            (ASTContext *)CONCAT17(bVar2,in_stack_ffffffffffffffe8));
      goto LAB_00ec2955;
    }
    if (SVar1 == DelayedSequenceExpr) {
      slang::syntax::SyntaxNode::as<slang::syntax::DelayedSequenceExprSyntax>(this);
      local_68 = SequenceConcatExpr::fromSyntax(in_stack_00000348,in_stack_00000340);
      goto LAB_00ec2955;
    }
    if (SVar1 == FirstMatchSequenceExpr) {
      slang::syntax::SyntaxNode::as<slang::syntax::FirstMatchSequenceExprSyntax>(this);
      local_68 = FirstMatchAssertionExpr::fromSyntax(syntax,context);
      goto LAB_00ec2955;
    }
    if ((SVar1 != IntersectSequenceExpr) && (SVar1 != OrSequenceExpr)) {
      if (SVar1 == ParenthesizedSequenceExpr) {
        pPVar4 = slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedSequenceExprSyntax>(this)
        ;
        if ((pPVar4->matchList == (SequenceMatchListSyntax *)0x0) &&
           (pPVar4->repetition == (SequenceRepetitionSyntax *)0x0)) {
          pSVar5 = not_null<slang::syntax::SequenceExprSyntax_*>::operator*
                             ((not_null<slang::syntax::SequenceExprSyntax_*> *)0xec28dc);
          iVar3 = bind((int)pSVar5,__addr,0);
          local_68 = (AssertionExpr *)CONCAT44(extraout_var,iVar3);
        }
        else {
          local_68 = SequenceWithMatchExpr::fromSyntax(syntax_00,context_00);
        }
        goto LAB_00ec2955;
      }
      if (SVar1 == SignalEventExpression) {
        slang::syntax::SyntaxNode::as<slang::syntax::SignalEventExpressionSyntax>(this);
        local_68 = ClockingAssertionExpr::fromSyntax
                             ((SignalEventExpressionSyntax *)pse,in_stack_00000010);
        goto LAB_00ec2955;
      }
      if (SVar1 == SimpleSequenceExpr) {
        slang::syntax::SyntaxNode::as<slang::syntax::SimpleSequenceExprSyntax>(this);
        local_68 = SimpleAssertionExpr::fromSyntax
                             (in_stack_000000c0,in_stack_000000b8,in_stack_000000b7);
        goto LAB_00ec2955;
      }
    }
  }
  slang::syntax::SyntaxNode::as<slang::syntax::BinarySequenceExprSyntax>(this);
  local_68 = BinaryAssertionExpr::fromSyntax
                       ((BinarySequenceExprSyntax *)in_stack_00000010,in_stack_00000008);
LAB_00ec2955:
  local_68->syntax = this;
  return (int)local_68;
}

Assistant:

const AssertionExpr& AssertionExpr::bind(const SequenceExprSyntax& syntax,
                                         const ASTContext& context, bool allowDisable) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    AssertionExpr* result;
    switch (syntax.kind) {
        case SyntaxKind::SimpleSequenceExpr:
            result = &SimpleAssertionExpr::fromSyntax(syntax.as<SimpleSequenceExprSyntax>(), ctx,
                                                      allowDisable);
            break;
        case SyntaxKind::DelayedSequenceExpr:
            result = &SequenceConcatExpr::fromSyntax(syntax.as<DelayedSequenceExprSyntax>(), ctx);
            break;
        case SyntaxKind::AndSequenceExpr:
        case SyntaxKind::OrSequenceExpr:
        case SyntaxKind::IntersectSequenceExpr:
        case SyntaxKind::ThroughoutSequenceExpr:
        case SyntaxKind::WithinSequenceExpr:
            result = &BinaryAssertionExpr::fromSyntax(syntax.as<BinarySequenceExprSyntax>(), ctx);
            break;
        case SyntaxKind::ParenthesizedSequenceExpr: {
            auto& pse = syntax.as<ParenthesizedSequenceExprSyntax>();
            if (pse.matchList || pse.repetition)
                result = &SequenceWithMatchExpr::fromSyntax(pse, ctx);
            else
                result = const_cast<AssertionExpr*>(&bind(*pse.expr, context));
            break;
        }
        case SyntaxKind::FirstMatchSequenceExpr:
            result = &FirstMatchAssertionExpr::fromSyntax(syntax.as<FirstMatchSequenceExprSyntax>(),
                                                          ctx);
            break;
        case SyntaxKind::ClockingSequenceExpr:
            result = &ClockingAssertionExpr::fromSyntax(syntax.as<ClockingSequenceExprSyntax>(),
                                                        ctx);
            break;
        case SyntaxKind::SignalEventExpression:
            result = &ClockingAssertionExpr::fromSyntax(syntax.as<SignalEventExpressionSyntax>(),
                                                        ctx);
            break;
        default:
            SLANG_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}